

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O0

int __thiscall
SubCircuit<0>::chooseEvidenceVar(SubCircuit<0> *this,vec<int> *options,int selectionMethod)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  SAT *this_00;
  uint *puVar6;
  int in_EDX;
  vec<int> *in_RSI;
  long in_RDI;
  int bestIndex;
  uniform_int_distribution<int> rnd_option;
  int satvar_1;
  Lit p_1;
  int v_1;
  uint i_1;
  int bestVar_1;
  int lowestLevel;
  int satvar;
  Lit p;
  int v;
  uint i;
  int bestVar;
  int highestLevel;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  uniform_int_distribution<int> *in_stack_ffffffffffffff20;
  long v_00;
  IntView<0> *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  lbool local_65;
  int local_64;
  uint local_60;
  int local_5c;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  local_1c = in_EDX;
  uVar3 = vec<int>::size(in_RSI);
  if ((uVar3 == 1) || (local_1c == 1)) {
    piVar5 = vec<int>::operator[](in_RSI,0);
    local_4 = *piVar5;
  }
  else if (local_1c == 2) {
    piVar5 = vec<int>::last(in_RSI);
    local_4 = *piVar5;
  }
  else if (local_1c == 3) {
    vec<int>::operator[](in_RSI,0);
    vec<int>::operator[](in_RSI,0);
    local_24 = (int)IntView<0>::getLit(in_stack_ffffffffffffff28,(int64_t)in_stack_ffffffffffffff20,
                                       in_stack_ffffffffffffff1c);
    uVar3 = ::var((Lit)local_24);
    piVar5 = vec<int>::operator[](&sat.trailpos,uVar3);
    local_20 = *piVar5;
    piVar5 = vec<int>::operator[](in_RSI,0);
    local_28 = *piVar5;
    for (local_2c = 0; uVar3 = local_2c, uVar4 = vec<int>::size(in_RSI), uVar3 < uVar4;
        local_2c = local_2c + 1) {
      vec<int>::operator[](in_RSI,0);
      vec<int>::operator[](in_RSI,0);
      local_30 = (int)IntView<0>::getLit(in_stack_ffffffffffffff28,
                                         (int64_t)in_stack_ffffffffffffff20,
                                         in_stack_ffffffffffffff1c);
      uVar3 = ::var((Lit)local_30);
      piVar5 = vec<int>::operator[](&sat.trailpos,uVar3);
      iVar1 = *piVar5;
      vec<int>::operator[](in_RSI,0);
      vec<int>::operator[](in_RSI,0);
      local_34 = (int)IntView<0>::getLit(in_stack_ffffffffffffff28,
                                         (int64_t)in_stack_ffffffffffffff20,
                                         in_stack_ffffffffffffff1c);
      uVar3 = ::var((Lit)local_34);
      piVar5 = vec<int>::operator[](&sat.trailpos,uVar3);
      if (iVar1 != *piVar5) {
        fprintf(_stderr,"not same\n");
      }
      piVar5 = vec<int>::operator[](in_RSI,local_2c);
      local_38 = *piVar5;
      local_44 = (int)IntView<0>::getLit(in_stack_ffffffffffffff28,
                                         (int64_t)in_stack_ffffffffffffff20,
                                         in_stack_ffffffffffffff1c);
      local_3c = local_44;
      local_40 = ::var((Lit)local_44);
      piVar5 = vec<int>::operator[](&sat.trailpos,local_40);
      if (local_20 < *piVar5) {
        piVar5 = vec<int>::operator[](&sat.trailpos,local_40);
        local_20 = *piVar5;
        local_28 = local_38;
      }
    }
    local_4 = local_28;
  }
  else if (local_1c == 4) {
    v_00 = *(long *)(in_RDI + 0x18);
    piVar5 = vec<int>::operator[](in_RSI,0);
    this_00 = (SAT *)(v_00 + (long)*piVar5 * 0x10);
    vec<int>::operator[](in_RSI,0);
    local_4c = (int)IntView<0>::getLit((IntView<0> *)this_00,v_00,in_stack_ffffffffffffff1c);
    uVar3 = ::var((Lit)local_4c);
    piVar5 = vec<int>::operator[](&sat.trailpos,uVar3);
    local_48 = *piVar5;
    piVar5 = vec<int>::operator[](in_RSI,0);
    local_50 = *piVar5;
    local_54 = 0;
    while (uVar3 = local_54, uVar4 = vec<int>::size(in_RSI), uVar3 < uVar4) {
      piVar5 = vec<int>::operator[](in_RSI,local_54);
      local_58 = *piVar5;
      local_64 = (int)IntView<0>::getLit((IntView<0> *)this_00,v_00,uVar3);
      local_5c = local_64;
      local_60 = ::var((Lit)local_64);
      piVar5 = vec<int>::operator[](&sat.trailpos,local_60);
      if (*piVar5 < local_48) {
        piVar5 = vec<int>::operator[](&sat.trailpos,local_60);
        local_48 = *piVar5;
        bVar2 = false;
        if (local_48 == 0) {
          local_65 = SAT::value(this_00,(Lit)(int)in_stack_ffffffffffffff30);
          bVar2 = lbool::operator!=(&local_65,::l_False);
        }
        if (bVar2 != false) {
          fprintf(_stderr,"level 0 not fixed\n");
        }
        local_50 = local_58;
      }
      local_54 = local_54 + 1;
    }
    local_4 = local_50;
  }
  else if (local_1c == 6) {
    vec<int>::size(in_RSI);
    std::uniform_int_distribution<int>::uniform_int_distribution
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    uVar3 = std::uniform_int_distribution<int>::operator()
                      (in_stack_ffffffffffffff20,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    puVar6 = (uint *)vec<int>::operator[](in_RSI,uVar3);
    piVar5 = vec<int>::operator[](in_RSI,*puVar6);
    local_4 = *piVar5;
  }
  else {
    piVar5 = vec<int>::operator[](in_RSI,0);
    local_4 = *piVar5;
  }
  return local_4;
}

Assistant:

int chooseEvidenceVar(vec<int> options, int selectionMethod) {
		if (options.size() == 1 || selectionMethod == 1) {
			// fprintf(stderr, "option 2 chose %d\n", options[0]);
			//  1 is the first
			return options[0];
		}
		if (selectionMethod == 2) {
			// fprintf(stderr, "option 1 chose %d\n", options[1]);
			//  the last
			return options.last();
		}
		/*   else if(selectionMethod == 3)
			 {
					 // highest activity
					 double highestAct = 0;
					 int bestVar = options[0];
					 for(int i = 0; i < options.size(); i++)
					 {
								int v = options[i];
								Lit p = x[v].getLit(v, LR_NE);
								int satvar = var(p);
							if(sat.activity[satvar] > highestAct)
							{
									 highestAct = sat.activity[satvar];
									 bestVar = v;
							}
					 }
					 return bestVar;
			 }
			 else if(selectionMethod == 4)
			 {
					 // lowest activity
					 double lowestAct = sat.activity[var(x[options[0]].getLit(options[0], LR_NE))];
					 int bestVar = options[0];
					 for(int i = 1; i < options.size(); i++)
					 {
								int v = options[i];
								Lit p = x[v].getLit(v, LR_NE);
								int satvar = var(p);
							if(sat.activity[satvar] < lowestAct)
							{
									 lowestAct = sat.activity[satvar];
									 bestVar = v;
							}
					 }
					 return bestVar;
			 }*/
		if (selectionMethod == 3) {
			// highest level
			// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
			// Maybe it should be replaced by sat.getLevel(.)?
			int highestLevel = sat.trailpos[var(x[options[0]].getLit(options[0], LR_EQ))];
			// int highestLevel = sat.getLevel(var(x[options[0]].getLit(options[0], LR_EQ)));
			int bestVar = options[0];
			for (unsigned int i = 0; i < options.size(); i++) {
				// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
				// Maybe it should be replaced by sat.getLevel(.)?
				if (sat.trailpos[var(x[options[0]].getLit(options[0], LR_EQ))] !=
						sat.trailpos[var(x[options[0]].getLit(options[0], LR_NE))]) {
					// if(sat.getLevel(var(x[options[0]].getLit(options[0], LR_EQ))) !=
					// sat.getLevel(var(x[options[0]].getLit(options[0], LR_NE))))
					fprintf(stderr, "not same\n");
				}
				const int v = options[i];
				const Lit p = x[v].getLit(v, LR_EQ);
				const int satvar = var(p);
				// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
				// Maybe it should be replaced by sat.getLevel(.)?
				if (sat.trailpos[satvar] > highestLevel)
				// if(sat.getLevel(satvar) > highestLevel)
				{
					// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
					// Maybe it should be replaced by sat.getLevel(.)?
					highestLevel = sat.trailpos[satvar];
					// highestLevel = sat.getLevel(satvar);
					bestVar = v;
				}
			}
			return bestVar;
		}
		if (selectionMethod == 4) {
			// lowest level
			// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
			// Maybe it should be replaced by sat.getLevel(.)?
			int lowestLevel = sat.trailpos[var(x[options[0]].getLit(options[0], LR_EQ))];
			// int lowestLevel = sat.getLevel(var(x[options[0]].getLit(options[0], LR_EQ)));
			int bestVar = options[0];
			for (unsigned int i = 0; i < options.size(); i++) {
				const int v = options[i];
				const Lit p = x[v].getLit(v, LR_EQ);
				const int satvar = var(p);
				// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
				// Maybe it should be replaced by sat.getLevel(.)?
				if (sat.trailpos[satvar] < lowestLevel)
				// if(sat.getLevel(satvar) < lowestLevel)
				{
					// XXX [AS] Replaced 'sat.level' by 'sat.trailpos', because it was replaced in rev. 441
					// Maybe it should be replaced by sat.getLevel(.)?
					lowestLevel = sat.trailpos[satvar];
					// lowestLevel = sat.getLevel(satvar);
					if (lowestLevel == 0 && (sat.value(p) != l_False)) {
						fprintf(stderr, "level 0 not fixed\n");
					}
					bestVar = v;
				}
			}
			return bestVar;
		}
		if (selectionMethod == 6) {
			// fprintf(stderr, "random\n");
			std::uniform_int_distribution<int> rnd_option(0, options.size() - 1);
			const int bestIndex = options[rnd_option(engine.rnd)];
			return options[bestIndex];
		}
		return options[0];
		fprintf(stderr, "unexpected evidence type\n");
	}